

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

string * __thiscall
t_go_generator::type_to_go_type_with_opt_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *type,bool optional_field)

{
  undefined1 *puVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  size_type *psVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *pcVar9;
  string maybe_pointer;
  string valueType;
  string keyType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  
  pcVar9 = "*";
  if ((int)CONCAT71(in_register_00000009,optional_field) == 0) {
    pcVar9 = "";
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,pcVar9,
             pcVar9 + (CONCAT71(in_register_00000009,optional_field) & 0xffffffff));
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
  if (((char)iVar4 != '\0') && (type[1].super_t_doc.has_doc_ == true)) {
    type = t_type::get_true_type(type);
  }
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[5])(type);
  if ((char)iVar4 != '\0') {
    switch(*(undefined4 *)&type[1].super_t_doc._vptr_t_doc) {
    case 0:
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    case 1:
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
      if ((char)iVar4 == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 5:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    default:
switchD_001fac9d_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_go_type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar4));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    goto LAB_001fadf5;
  }
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[10])(type);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
    if (((char)iVar4 != '\0') ||
       (iVar4 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type), (char)iVar4 != '\0')) {
      type_name_abi_cxx11_(&local_f0,this,type);
      publicize(&local_d0,this,&local_f0,false,&(this->super_t_generator).service_name_);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x37a119);
      goto LAB_001fad90;
    }
    iVar4 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
      if ((char)iVar4 != '\0') {
        type_to_go_type_with_opt_abi_cxx11_
                  (&local_d0,this,*(t_type **)&type[1].super_t_doc.has_doc_,false);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 2;
        local_b0.field_2._M_allocated_capacity._0_3_ = 0x5d5b;
        std::operator+(&local_f0,&local_110,&local_b0);
        std::operator+(__return_storage_ptr__,&local_f0,&local_d0);
LAB_001fb0df:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        local_f0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001fb288;
        goto LAB_001fb28d;
      }
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
      if ((char)iVar4 != '\0') {
        type_to_go_type_with_opt_abi_cxx11_
                  (&local_d0,this,*(t_type **)&type[1].super_t_doc.has_doc_,false);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 2;
        local_b0.field_2._M_allocated_capacity._0_3_ = 0x5d5b;
        std::operator+(&local_f0,&local_110,&local_b0);
        std::operator+(__return_storage_ptr__,&local_f0,&local_d0);
        goto LAB_001fb0df;
      }
      iVar4 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
      if ((char)iVar4 == '\0') goto switchD_001fac9d_default;
      type_name_abi_cxx11_(&local_f0,this,type);
      publicize(&local_d0,this,&local_f0,false,&(this->super_t_generator).service_name_);
      std::operator+(__return_storage_ptr__,&local_110,&local_d0);
      goto LAB_001fadcf;
    }
    type_to_go_key_type_abi_cxx11_(&local_d0,this,*(t_type **)&type[1].super_t_doc.has_doc_);
    type_to_go_type_with_opt_abi_cxx11_
              (&local_f0,this,*(t_type **)&type[1].annotations_._M_t._M_impl,false);
    local_40 = 0x5b70616d;
    local_48 = 4;
    local_3c = 0;
    local_50 = &local_40;
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_50,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_001fb288:
      operator_delete(local_f0._M_dataplus._M_p);
    }
LAB_001fb28d:
    psVar3 = &local_d0;
  }
  else {
    type_name_abi_cxx11_(&local_f0,this,type);
    publicize(&local_d0,this,&local_f0,false,&(this->super_t_generator).service_name_);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_d0,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
LAB_001fad90:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
LAB_001fadcf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    psVar3 = &local_f0;
  }
  puVar1 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar3->field_2) {
    operator_delete(puVar1);
  }
LAB_001fadf5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::type_to_go_type_with_opt(t_type* type,
                                                bool optional_field) {
  string maybe_pointer(optional_field ? "*" : "");

  if (type->is_typedef() && ((t_typedef*)type)->is_forward_typedef()) {
    type = ((t_typedef*)type)->get_true_type();
  }

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();

    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "";

    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        return maybe_pointer + "[]byte";
      }

      return maybe_pointer + "string";

    case t_base_type::TYPE_BOOL:
      return maybe_pointer + "bool";

    case t_base_type::TYPE_I8:
      return maybe_pointer + "int8";

    case t_base_type::TYPE_I16:
      return maybe_pointer + "int16";

    case t_base_type::TYPE_I32:
      return maybe_pointer + "int32";

    case t_base_type::TYPE_I64:
      return maybe_pointer + "int64";

    case t_base_type::TYPE_DOUBLE:
      return maybe_pointer + "float64";
    }
  } else if (type->is_enum()) {
    return maybe_pointer + publicize(type_name(type));
  } else if (type->is_struct() || type->is_xception()) {
    return "*" + publicize(type_name(type));
  } else if (type->is_map()) {
    t_map* t = (t_map*)type;
    string keyType = type_to_go_key_type(t->get_key_type());
    string valueType = type_to_go_type(t->get_val_type());
    return maybe_pointer + string("map[") + keyType + "]" + valueType;
  } else if (type->is_set()) {
    t_set* t = (t_set*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_list()) {
    t_list* t = (t_list*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_typedef()) {
    return maybe_pointer + publicize(type_name(type));
  }

  throw "INVALID TYPE IN type_to_go_type: " + type->get_name();
}